

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.h
# Opt level: O2

void __thiscall InvertDatabase::get_ext_item(InvertDatabase *this,int it)

{
  Partition *this_00;
  pointer piVar1;
  pointer psVar2;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar3;
  int supsz;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> newit;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar3 = Partition::partition_get_idxsup
                    ((this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,it);
  std::make_shared<std::vector<int,std::allocator<int>>,int&>((int *)&local_58);
  this_00 = (this->partition).super___shared_ptr<Partition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_48,&local_58);
  Partition::partition_read_item
            (this_00,(shared_ptr<std::vector<int,_std::allocator<int>_>_> *)&local_48,it);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  piVar1 = (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->_items).
           super__Vector_base<std::shared_ptr<Itemset>,_std::allocator<std::shared_ptr<Itemset>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (psVar2[piVar1[it]].super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->theSupport =
       iVar3;
  *(int *)(*(long *)&((psVar2[piVar1[it]].super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2> + 0x10
          ) = iVar3;
  this_01 = *(__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2> **)
             &((psVar2[piVar1[it]].super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              theIval).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_38,&local_58);
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this_01,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  return;
}

Assistant:

void get_ext_item(int it) {
        int supsz = partition->partition_get_idxsup(it);
        shared_ptr<vint> newit = make_shared<vint>(supsz);
        partition->partition_read_item(newit, it);
        _items[fidx[it]]->set_support(supsz);
        _items[fidx[it]]->ival()->set_size(supsz);
        _items[fidx[it]]->ival()->set_array(newit);
    }